

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,2>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  uint *puVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  
  fVar2 = k->A;
  for (iVar6 = k->v1; iVar6 != k->v2; iVar6 = iVar6 + 1) {
    iVar4 = k->rowlen - iVar6;
    iVar5 = iVar4 - k->w2;
    if (iVar5 < k->u1) {
      iVar5 = k->u1;
    }
    iVar4 = iVar4 - k->w1;
    if (k->u2 < iVar4) {
      iVar4 = k->u2;
    }
    fVar8 = (float)iVar5 - k->u;
    fVar9 = (float)iVar6 - k->v;
    fVar11 = (fVar8 + fVar8 + 1.0) * k->A + fVar9 * k->B;
    fVar8 = k->A * fVar8 * fVar8 + (k->B * fVar8 + k->C * fVar9) * fVar9;
    puVar7 = (uint *)((long)data + (long)((k->rowlen * iVar6 + iVar5) * 2) * 2);
    puVar1 = (uint *)((long)puVar7 + (long)((iVar4 - iVar5) * 2) * 2);
    for (; puVar7 < puVar1; puVar7 = puVar7 + 1) {
      if (fVar8 < 1.0) {
        fVar9 = anon_unknown_2::gaussian(fVar8);
        fVar9 = fVar9 * k->wscale;
        k->weight = k->weight + fVar9;
        uVar3 = *puVar7;
        auVar10._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
        auVar10._4_2_ = (short)(uVar3 >> 0x10);
        auVar10._0_4_ = uVar3;
        *(ulong *)result =
             CONCAT44(fVar9 * (float)auVar10._4_4_ + (float)((ulong)*(undefined8 *)result >> 0x20),
                      fVar9 * (float)(uVar3 & 0xffff) + (float)*(undefined8 *)result);
      }
      fVar8 = fVar8 + fVar11;
      fVar11 = fVar11 + fVar2 + fVar2;
    }
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }